

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_objects.cxx
# Opt level: O2

void __thiscall
xray_re::xr_custom_object::xr_custom_object
          (xr_custom_object *this,xr_scene *scene,tools_class_id class_id)

{
  this->_vptr_xr_custom_object = (_func_int **)&PTR__xr_custom_object_00239c80;
  this->m_scene = scene;
  this->m_class_id = class_id;
  this->m_flags = 2;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  (this->m_name)._M_string_length = 0;
  (this->m_name).field_2._M_local_buf[0] = '\0';
  this->m_motion = (xr_obj_motion *)0x0;
  this->m_time = 0.0;
  *(undefined8 *)((long)&(this->m_rotation).field_0 + 4) = 0;
  *(undefined8 *)&(this->m_position).field_0 = 0;
  *(undefined8 *)((long)&(this->m_position).field_0 + 8) = 0;
  *(undefined8 *)&(this->m_scale).field_0 = 0x3f8000003f800000;
  (this->m_scale).field_0.field_0.z = 1.0;
  return;
}

Assistant:

xr_custom_object::xr_custom_object(xr_scene& scene, tools_class_id class_id):
	m_scene(scene), m_class_id(class_id),
	m_flags(COF_VISIBLE), m_motion(0), m_time(0)
{
	m_position.set();
	m_rotation.set();
	m_scale.set(1.f, 1.f, 1.f);
}